

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O3

void __thiscall Assimp::D3MF::XmlSerializer::ReadMetadata(XmlSerializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string name;
  MetaEntry entry;
  string value;
  long *local_98;
  long local_90;
  long local_88 [2];
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long *local_38 [2];
  long local_28 [2];
  
  iVar1 = (*this->xmlReader->_vptr_IIrrXMLReader[7])(this->xmlReader,XmlTag::meta_name_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,(char *)CONCAT44(extraout_var,iVar1),(allocator<char> *)local_78);
  (*this->xmlReader->_vptr_IIrrXMLReader[2])();
  iVar1 = (*this->xmlReader->_vptr_IIrrXMLReader[0xe])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,(char *)CONCAT44(extraout_var_00,iVar1),(allocator<char> *)local_78)
  ;
  if (local_90 != 0) {
    local_78._8_8_ = 0;
    local_78[0x10] = '\0';
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_78._0_8_ = local_78 + 0x10;
    local_58._M_p = (pointer)&local_48;
    std::__cxx11::string::_M_assign((string *)local_78);
    std::__cxx11::string::_M_assign((string *)&local_58);
    std::
    vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
    ::push_back(&this->mMetaData,(value_type *)local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,
                      CONCAT71(local_48._M_allocated_capacity._1_7_,local_48._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,CONCAT71(local_78._17_7_,local_78[0x10]) + 1);
    }
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return;
}

Assistant:

void ReadMetadata() {
        const std::string name = xmlReader->getAttributeValue( D3MF::XmlTag::meta_name.c_str() );
        xmlReader->read();
        const std::string value = xmlReader->getNodeData();

        if ( name.empty() ) {
            return;
        }

        MetaEntry entry;
        entry.name = name;
        entry.value = value;
        mMetaData.push_back( entry );
    }